

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::change_dxt1_to_dxt1a(mipmapped_texture *this)

{
  component_flags cVar1;
  uint uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  mip_level **ppmVar4;
  dxt_image *pdVar5;
  uint local_18;
  uint local_14;
  uint l;
  uint f;
  mipmapped_texture *this_local;
  
  if (this->m_format == PIXEL_FMT_DXT1) {
    this->m_format = PIXEL_FMT_DXT1A;
    cVar1 = pixel_format_helpers::get_component_flags(this->m_format);
    this->m_comp_flags = cVar1;
    for (local_14 = 0; uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&this->m_faces),
        local_14 < uVar2; local_14 = local_14 + 1) {
      local_18 = 0;
      while( true ) {
        pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14);
        uVar2 = vector<crnlib::mip_level_*>::size(pvVar3);
        if (uVar2 <= local_18) break;
        pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14);
        ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_18);
        pdVar5 = mip_level::get_dxt_image(*ppmVar4);
        if (pdVar5 != (dxt_image *)0x0) {
          pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14)
          ;
          ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_18);
          mip_level::set_format(*ppmVar4,this->m_format);
          pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14)
          ;
          ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_18);
          mip_level::set_comp_flags(*ppmVar4,this->m_comp_flags);
          pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_14)
          ;
          ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_18);
          pdVar5 = mip_level::get_dxt_image(*ppmVar4);
          dxt_image::change_dxt1_to_dxt1a(pdVar5);
        }
        local_18 = local_18 + 1;
      }
    }
  }
  return;
}

Assistant:

void mipmapped_texture::change_dxt1_to_dxt1a() {
  if (m_format != PIXEL_FMT_DXT1)
    return;

  m_format = PIXEL_FMT_DXT1A;

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);

  for (uint f = 0; f < m_faces.size(); f++) {
    for (uint l = 0; l < m_faces[f].size(); l++) {
      if (m_faces[f][l]->get_dxt_image()) {
        m_faces[f][l]->set_format(m_format);
        m_faces[f][l]->set_comp_flags(m_comp_flags);

        m_faces[f][l]->get_dxt_image()->change_dxt1_to_dxt1a();
      }
    }
  }
}